

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

char * deep_str_copy(char *src)

{
  size_t sVar1;
  char *in_RDI;
  char *dst;
  size_t len;
  undefined8 local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    sVar1 = strlen(in_RDI);
    local_8 = (char *)malloc(sVar1 + 1);
    memcpy(local_8,in_RDI,sVar1 + 1);
  }
  return local_8;
}

Assistant:

const char *deep_str_copy(const char *src) {
    if (!src) {
        return src;
    }
    size_t len = strlen(src) + 1;
    char *dst = malloc(len);
    memcpy(dst, src, len);
    return dst;
}